

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.hpp
# Opt level: O2

void __thiscall Kernel::Literal::Literal(Literal *this,uint functor,uint arity,bool polarity)

{
  undefined7 in_register_00000009;
  
  Term::Term(&this->super_Term);
  (this->super_Term)._vptr_Term = (_func_int **)&PTR_computable_009ff6d0;
  (this->super_Term)._functor = functor;
  *(uint *)&(this->super_Term).field_0xc =
       *(uint *)&(this->super_Term).field_0xc & 0xf0000000 | arity & 0xfffffff;
  (this->super_Term)._args[0]._content =
       ((this->super_Term)._args[0]._content & 0xffffffffffffffcb) +
       (CONCAT71(in_register_00000009,polarity) & 0xffffffff) * 4 + 0x10;
  return;
}

Assistant:

Literal(unsigned functor,unsigned arity,bool polarity) throw()
  {
    _functor = functor;
    _arity = arity;
    _args[0]._setPolarity(polarity);
    _args[0]._setSort(false);
    _args[0]._setLiteral(true);
  }